

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::IFCImporter::CanRead(IFCImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string local_50;
  char *tokens [1];
  
  BaseImporter::GetExtension(&local_50,pFile);
  bVar1 = std::operator==(&local_50,"ifc");
  bVar2 = true;
  if (bVar1) goto LAB_004811fb;
  bVar1 = std::operator==(&local_50,"ifczip");
  if (bVar1) goto LAB_004811fb;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_004811cf;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_004811cf:
    tokens[0] = "ISO-10303-21";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
    goto LAB_004811fb;
  }
  bVar2 = false;
LAB_004811fb:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool IFCImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "ifc" || extension == "ifczip" ) {
        return true;
    } else if ((!extension.length() || checkSig) && pIOHandler)   {
        // note: this is the common identification for STEP-encoded files, so
        // it is only unambiguous as long as we don't support any further
        // file formats with STEP as their encoding.
        const char* tokens[] = {"ISO-10303-21"};
        const bool found( SearchFileHeaderForToken( pIOHandler, pFile, tokens, 1 ) );
        return found;
    }
    return false;
}